

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::BeginBinary(Node *this,StreamWriterLE *s)

{
  uint8_t n;
  size_t sVar1;
  StreamWriterLE *s_local;
  Node *this_local;
  
  sVar1 = StreamWriter<false,_false>::Tell(s);
  this->start_pos = sVar1;
  StreamWriter<false,_false>::PutU4(s,0);
  StreamWriter<false,_false>::PutU4(s,0);
  StreamWriter<false,_false>::PutU4(s,0);
  n = std::__cxx11::string::size();
  StreamWriter<false,_false>::PutU1(s,n);
  StreamWriter<false,_false>::PutString(s,&this->name);
  sVar1 = StreamWriter<false,_false>::Tell(s);
  this->property_start = sVar1;
  return;
}

Assistant:

void FBX::Node::BeginBinary(Assimp::StreamWriterLE &s)
{
    // remember start pos so we can come back and write the end pos
    this->start_pos = s.Tell();

    // placeholders for end pos and property section info
    s.PutU4(0); // end pos
    s.PutU4(0); // number of properties
    s.PutU4(0); // total property section length

    // node name
    s.PutU1(uint8_t(name.size())); // length of node name
    s.PutString(name); // node name as raw bytes

    // property data comes after here
    this->property_start = s.Tell();
}